

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpStateVarComplete.c
# Opt level: O3

UpnpStateVarComplete * UpnpStateVarComplete_new(void)

{
  UpnpStateVarComplete *pUVar1;
  UpnpString *pUVar2;
  
  pUVar1 = (UpnpStateVarComplete *)calloc(1,0x20);
  if (pUVar1 != (UpnpStateVarComplete *)0x0) {
    pUVar2 = UpnpString_new();
    pUVar1->m_CtrlUrl = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_StateVarName = pUVar2;
  }
  return pUVar1;
}

Assistant:

UpnpStateVarComplete *UpnpStateVarComplete_new(void)
{
	struct s_UpnpStateVarComplete *p =
		calloc(1, sizeof(struct s_UpnpStateVarComplete));

	if (!p)
		return 0;

	/*p->m_ErrCode = 0;*/
	p->m_CtrlUrl = UpnpString_new();
	p->m_StateVarName = UpnpString_new();
	/*p->m_CurrentVal = 0;*/

	return (UpnpStateVarComplete *)p;
}